

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O3

int32_t FastPForLib::Simple9_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint32_t *output,
                  int32_t outOffset)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar5 = inCount + inOffset;
  uVar4 = outOffset;
  uVar3 = outOffset;
  if ((uint)inOffset < uVar5) {
    do {
      lVar9 = 0;
      do {
        uVar4 = (&Simple9_Codec_intNumber)[lVar9];
        if (uVar5 - inOffset <= (uint)(&Simple9_Codec_intNumber)[lVar9]) {
          uVar4 = uVar5 - inOffset;
        }
        uVar6 = (int)lVar9 << 0x1c;
        if (uVar4 == 0) {
          uVar8 = 0;
        }
        else {
          uVar7 = 0;
          uVar8 = 0;
          while (iVar2 = (int)uVar8,
                input[(uint)(inOffset + iVar2)] >> ((&Simple9_Codec_bitLength)[lVar9] & 0x1f) == 0)
          {
            uVar1 = uVar7 & 0x1f;
            uVar8 = uVar8 + 1;
            uVar7 = uVar7 + (&Simple9_Codec_bitLength)[lVar9];
            uVar6 = uVar6 | input[(uint)(inOffset + iVar2)] << uVar1;
            if (uVar4 == uVar8) goto LAB_00127356;
          }
        }
        if ((uint)uVar8 == uVar4) {
LAB_00127356:
          inOffset = inOffset + uVar4;
          if (lVar9 != 8) goto LAB_0012736d;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      uVar8 = (ulong)(uint)inOffset;
      inOffset = inOffset + 1;
      uVar6 = input[uVar8] | 0x80000000;
LAB_0012736d:
      uVar4 = uVar3 + 1;
      output[uVar3] = uVar6;
      uVar3 = uVar4;
    } while ((uint)inOffset < uVar5);
  }
  return uVar4 - outOffset;
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint32_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint32_t outVal = 0;

#if defined(_SIMPLE9_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint32_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (RLE_SELECTOR_VALUE << SIMPLE9_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += repeatCount;
      } else
#endif
      {
        // try all the bit packing possibilities
        uint32_t code = SIMPLE9_MINCODE;
        for (; code < SIMPLE9_MAXCODE; code++) {
          uint32_t intNum = Simple9_Codec_intNumber[code];
          uint32_t bitLen = Simple9_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint32_t maxVal = (1U << bitLen) - 1;
          uint32_t val = code << SIMPLE9_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint32_t inputVal = input[inPos + j];
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value (up to INT_MAX)
        if (code == SIMPLE9_MAXCODE) {
          outVal = (code << SIMPLE9_BITSIZE) | input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }